

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O1

void __thiscall
ps::Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
emit_signal(Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            *this,int type_signal)

{
  mutex *__mutex;
  mapped_type mVar1;
  int iVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  uint local_1c;
  
  __mutex = &this->m;
  local_1c = type_signal;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_signals,(key_type_conflict *)&local_1c);
    mVar1 = *pmVar3;
    *pmVar3 = mVar1 + 1;
    if ((long)(this->m_topics).
              super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_topics).
              super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4 == (ulong)(mVar1 + 1)) {
      pmVar3 = std::
               map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               ::operator[](&this->m_signals,(key_type_conflict *)&local_1c);
      *pmVar3 = 0;
      (**this->_vptr_Publisher)(this,(ulong)local_1c);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar4 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

void emit_signal(int type_signal)
		{
			std::lock_guard<std::mutex> l{m};
			if (++m_signals[type_signal] == m_topics.size())
			{
				m_signals[type_signal] = 0;
				signal(type_signal);
			}
		}